

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  MppCodingType MVar1;
  MpiEncTestArgs *pMVar2;
  MppApi *pMVar3;
  MppCtx pvVar4;
  MppEncCfg pvVar5;
  MppFrame pvVar6;
  MppApi **ppMVar7;
  MppCtx *ppvVar8;
  MPP_RET MVar9;
  int iVar10;
  RK_S32 RVar11;
  undefined4 uVar12;
  MpiEncTestArgs *cmd;
  MpiRc2TestCtx *ctx;
  size_t sVar13;
  FILE *pFVar14;
  RK_S64 RVar15;
  void *__ptr;
  RK_U8 *pRVar16;
  undefined8 uVar17;
  long lVar18;
  ulong uVar19;
  RK_U32 RVar20;
  int iVar21;
  char *pcVar22;
  RK_U32 RVar23;
  MppPacket *ppvVar24;
  uint uVar25;
  MppBufferGroup *ppvVar26;
  char *pcVar27;
  double dVar28;
  MppPollType block;
  MppPollType block_1;
  MppFrameFormat format;
  RK_U32 fast_en;
  MppFrame local_a0;
  MppBufferGroup *local_98;
  MppParam local_90;
  undefined4 local_84;
  MpiEncTestArgs *local_80;
  MppPacket *local_78;
  undefined4 local_6c;
  MppApi **local_68;
  MppCtx *local_60;
  MppApi **local_58;
  MppCtx *local_50;
  MppApi **local_48;
  MppCtx *local_40;
  int local_34;
  
  cmd = mpi_enc_test_cmd_get();
  MVar9 = mpi_enc_test_cmd_update_by_args(cmd,argc,argv);
  if (MVar9 != MPP_OK) goto LAB_00107726;
  mpi_enc_test_cmd_show_opt(cmd);
  ctx = (MpiRc2TestCtx *)mpp_osal_calloc("main",0x2a0);
  if (ctx == (MpiRc2TestCtx *)0x0) {
    MVar9 = MPP_ERR_MALLOC;
    goto LAB_00107726;
  }
  ctx->enc_cmd = cmd;
  if (cmd->file_input == (char *)0x0) {
    pcVar22 = (char *)0x0;
  }
  else {
    reader_init(&ctx->reader,cmd->file_input,cmd->type_src);
    pcVar22 = cmd->file_input;
  }
  if (ctx->reader == (FileReader)0x0) {
    _mpp_log_l(2,"mpi_rc_test","failed to open dec input file %s\n",0,pcVar22);
    MVar9 = MPP_NOK;
LAB_00106b7c:
    _mpp_log_l(2,"mpi_rc_test","mpi_rc_init failded ret %d",0,MVar9);
  }
  else {
    sVar13 = reader_size(ctx->reader);
    _mpp_log_l(4,"mpi_rc_test","input file %s size %ld\n",0,pcVar22,sVar13);
    ctx->dec_type = cmd->type_src;
    if (cmd->file_output != (char *)0x0) {
      pFVar14 = fopen(cmd->file_output,"w+b");
      (ctx->file).fp_enc_out = (FILE *)pFVar14;
      if (pFVar14 == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_rc_test","failed to open enc output file %s\n",0,cmd->file_output);
        MVar9 = MPP_ERR_OPEN_FILE;
        goto LAB_00106b7c;
      }
    }
    ppvVar26 = &ctx->pkt_grp;
    iVar10 = mpp_buffer_group_get(ppvVar26,1,0,"mpi_rc_test","mpi_rc_buffer_init");
    if (iVar10 == 0) {
      pRVar16 = (RK_U8 *)mpp_osal_calloc("mpi_rc_buffer_init",0x40000);
      ctx->dec_in_buf_post = pRVar16;
      if (pRVar16 == (RK_U8 *)0x0) {
        _mpp_log_l(2,"mpi_rc_test","mpi_dec_test malloc input stream buffer failed\n",0);
        goto LAB_00106a39;
      }
      ctx->dec_in_buf_post_size = 0x40000;
      ctx->frm_idx = 0;
      ctx->calc_base_idx = 0;
      ctx->stream_size_1s = 0;
LAB_00106b15:
      pMVar2 = ctx->enc_cmd;
      local_a0 = (MppFrame)((ulong)local_a0 & 0xffffffff00000000);
      local_90 = (MppParam)((ulong)local_90 & 0xffffffff00000000);
      local_40 = &ctx->dec_ctx_post;
      local_48 = &ctx->dec_mpi_post;
      local_98 = ppvVar26;
      MVar9 = mpp_create();
      if (MVar9 == MPP_OK) {
        pvVar4 = ctx->dec_ctx_post;
        pMVar3 = ctx->dec_mpi_post;
        MVar9 = mpp_packet_init(&ctx->dec_pkt_post,ctx->dec_in_buf_post,ctx->dec_in_buf_post_size);
        if (MVar9 != MPP_OK) {
          pcVar22 = "mpp_packet_init failed\n";
          goto LAB_00106c9b;
        }
        MVar9 = (*pMVar3->control)(pvVar4,MPP_DEC_SET_PARSER_SPLIT_MODE,&local_90);
        if (MVar9 != MPP_OK) {
          pcVar22 = "dec_mpi->control failed\n";
          goto LAB_00106c9b;
        }
        MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_INPUT_TIMEOUT,&local_a0);
        if (MVar9 != MPP_OK) {
          pcVar22 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
          goto LAB_00106c9b;
        }
        local_a0 = (MppFrame)((ulong)local_a0 & 0xffffffff00000000);
        MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_OUTPUT_TIMEOUT,&local_a0);
        if (MVar9 != MPP_OK) {
          pcVar22 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
          goto LAB_00106c9b;
        }
        MVar9 = mpp_init(pvVar4,0,pMVar2->type);
        if (MVar9 != MPP_OK) {
          pcVar22 = "mpp_init dec failed\n";
          goto LAB_00106c9b;
        }
LAB_00106cb1:
        local_a0 = (MppFrame)CONCAT44(local_a0._4_4_,1);
        local_90 = (MppParam)((ulong)local_90 & 0xffffffff00000000);
        local_6c = 0;
        local_84 = 0;
        local_34 = 0;
        mpp_env_get_u32("fbc_dec_en",&local_34,0);
        mpp_env_get_u32("fast_en",&local_6c,0);
        if (local_34 != 0) {
          local_84 = 0x200000;
        }
        local_60 = &ctx->dec_ctx_pre;
        local_68 = &ctx->dec_mpi_pre;
        MVar9 = mpp_create();
        if (MVar9 == MPP_OK) {
          pvVar4 = ctx->dec_ctx_pre;
          pMVar3 = ctx->dec_mpi_pre;
          MVar9 = mpp_packet_init(&ctx->dec_pkt_pre,ctx->dec_in_buf_pre,ctx->dec_in_buf_pre_size);
          if (MVar9 != MPP_OK) {
            pcVar22 = "mpp_packet_init failed\n";
            goto LAB_00106d90;
          }
          MVar9 = (*pMVar3->control)(pvVar4,MPP_DEC_SET_PARSER_SPLIT_MODE,&local_a0);
          pcVar22 = "dec_mpi->control failed\n";
          if ((MVar9 != MPP_OK) ||
             (MVar9 = (*pMVar3->control)(pvVar4,MPP_DEC_SET_PARSER_FAST_MODE,&local_6c),
             MVar9 != MPP_OK)) goto LAB_00106d90;
          MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_INPUT_TIMEOUT,&local_90);
          if (MVar9 != MPP_OK) {
            pcVar22 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
            goto LAB_00106d90;
          }
          local_90 = (MppParam)((ulong)local_90 & 0xffffffff00000000);
          MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_OUTPUT_TIMEOUT,&local_90);
          if (MVar9 != MPP_OK) {
            pcVar22 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
            goto LAB_00106d90;
          }
          MVar9 = mpp_init(pvVar4,0,ctx->dec_type);
          if (MVar9 != MPP_OK) {
            pcVar22 = "mpp_init dec failed\n";
            goto LAB_00106d90;
          }
          MVar9 = (*pMVar3->control)(pvVar4,MPP_DEC_SET_OUTPUT_FORMAT,&local_84);
          if (MVar9 != MPP_OK) goto LAB_00106d90;
        }
        else {
          pcVar22 = "mpp_create decoder failed\n";
LAB_00106d90:
          _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
          if (MVar9 < MPP_OK) goto LAB_00107580;
        }
        iVar10 = mpp_enc_cfg_init(&ctx->cfg);
        if (-1 < iVar10) {
          pMVar2 = ctx->enc_cmd;
          local_90 = (MppParam)CONCAT44(local_90._4_4_,1);
          ppvVar24 = (MppPacket *)ctx->cfg;
          local_6c = 0;
          local_84 = 0;
          local_50 = &ctx->enc_ctx;
          local_58 = &ctx->enc_mpi;
          MVar9 = mpp_create();
          local_80 = cmd;
          if (MVar9 == MPP_OK) {
            pvVar4 = ctx->enc_ctx;
            pMVar3 = ctx->enc_mpi;
            (ctx->rc_cfg).fps_out_num = 0x1e;
            (ctx->rc_cfg).fps_out_denom = 1;
            (ctx->rc_cfg).fps_in_flex = 0;
            (ctx->rc_cfg).fps_in_num = 0x1e;
            (ctx->rc_cfg).fps_in_denom = 1;
            (ctx->rc_cfg).fps_out_flex = 0;
            (ctx->rc_cfg).max_reenc_times = 1;
            (ctx->rc_cfg).gop = pMVar2->gop_len;
            local_a0 = (MppFrame)CONCAT44(local_a0._4_4_,0xffffffff);
            MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_INPUT_TIMEOUT,&local_a0);
            if (MVar9 != MPP_OK) {
              pcVar22 = "enc_mpi->control MPP_SET_INPUT_TIMEOUT failed\n";
LAB_00106ee7:
              _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
              cmd = local_80;
              ppvVar26 = local_98;
              goto LAB_00106eff;
            }
            local_a0 = (MppFrame)CONCAT44(local_a0._4_4_,0xffffffff);
            MVar9 = (*pMVar3->control)(pvVar4,MPP_SET_OUTPUT_TIMEOUT,&local_a0);
            if (MVar9 != MPP_OK) {
              pcVar22 = "enc_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
              goto LAB_00106ee7;
            }
            MVar9 = mpp_init(pvVar4,1,pMVar2->type);
            if (MVar9 != MPP_OK) {
              pcVar22 = "mpp_init enc failed\n";
              goto LAB_00106ee7;
            }
            if (pMVar2->width != 0) {
              mpp_enc_cfg_set_s32(ppvVar24,"prep:width");
            }
            if (pMVar2->height != 0) {
              mpp_enc_cfg_set_s32(ppvVar24,"prep:height");
            }
            if (pMVar2->hor_stride != 0) {
              mpp_enc_cfg_set_s32(ppvVar24,"prep:hor_stride");
            }
            if (pMVar2->ver_stride != 0) {
              mpp_enc_cfg_set_s32(ppvVar24,"prep:ver_stride");
            }
            mpp_enc_cfg_set_s32(ppvVar24,"prep:format",0);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:mode",pMVar2->rc_mode);
            iVar10 = pMVar2->rc_mode;
            local_78 = ppvVar24;
            if (iVar10 == 0) {
              mpp_enc_cfg_set_s32(ppvVar24,"rc:bps_target",pMVar2->bps_target);
              iVar10 = pMVar2->bps_max;
              if (iVar10 == 0) {
                iVar21 = pMVar2->bps_target * 0x11;
                iVar10 = pMVar2->bps_target * 0x11 + 0xf;
                if (-1 < iVar21) {
                  iVar10 = iVar21;
                }
                iVar10 = iVar10 >> 4;
              }
              mpp_enc_cfg_set_s32(ppvVar24,"rc:bps_max",iVar10);
              if (pMVar2->bps_min == 0) {
                iVar10 = pMVar2->bps_target;
                iVar21 = iVar10 + 0xf;
                if (-1 < iVar10) {
                  iVar21 = iVar10;
                }
                RVar11 = iVar21 >> 4;
              }
              else {
LAB_001078f5:
                RVar11 = pMVar2->bps_max;
              }
LAB_0010794a:
              ppvVar24 = local_78;
              mpp_enc_cfg_set_s32(local_78,"rc:bps_min",RVar11);
            }
            else if (iVar10 != 2) {
              if (iVar10 == 1) {
                mpp_enc_cfg_set_s32(ppvVar24,"rc:bps_target",pMVar2->bps_target);
                iVar10 = pMVar2->bps_max;
                if (iVar10 == 0) {
                  iVar10 = (pMVar2->bps_target * 3) / 2;
                }
                mpp_enc_cfg_set_s32(ppvVar24,"rc:bps_max",iVar10);
                if (pMVar2->bps_min != 0) goto LAB_001078f5;
                RVar11 = pMVar2->bps_target / 2;
                goto LAB_0010794a;
              }
              _mpp_log_l(2,"mpi_rc_test","unsupport encoder rc mode %d\n","mpi_rc_enc_init");
            }
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_in_flex",(ctx->rc_cfg).fps_in_flex);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_in_num",(ctx->rc_cfg).fps_in_num);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_in_denom",(ctx->rc_cfg).fps_in_denom);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_out_flex",(ctx->rc_cfg).fps_out_flex);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_out_num",(ctx->rc_cfg).fps_out_num);
            mpp_enc_cfg_set_s32(ppvVar24,"rc:fps_out_denom",(ctx->rc_cfg).fps_out_denom);
            iVar10 = 0x3c;
            if (pMVar2->gop_len != 0) {
              iVar10 = pMVar2->gop_len;
            }
            mpp_enc_cfg_set_s32(ppvVar24,"rc:gop",iVar10);
            mpp_enc_cfg_set_u32(ppvVar24,"rc:drop_mode",0);
            mpp_enc_cfg_set_u32(ppvVar24,"rc:drop_thd",0x14);
            mpp_enc_cfg_set_u32(ppvVar24,"rc:drop_gap",1);
            mpp_env_get_u32("dbrh_en",&local_6c,0);
            mpp_env_get_u32("dbrh_s",&local_84,0x10);
            mpp_enc_cfg_set_u32(local_78,"rc:debreath_en",local_6c);
            ppvVar24 = local_78;
            mpp_enc_cfg_set_u32(local_78,"rc:debreath_strength",local_84);
            mpp_enc_cfg_set_s32(ppvVar24,"codec:type",pMVar2->type);
            MVar1 = pMVar2->type;
            if ((int)MVar1 < 9) {
              if (MVar1 == MPP_VIDEO_CodingAVC) {
                mpp_enc_cfg_set_s32(ppvVar24,"h264:profile",100);
                mpp_enc_cfg_set_s32(ppvVar24,"h264:level",0x28);
                mpp_enc_cfg_set_s32(ppvVar24,"h264:cabac_en",1);
                mpp_enc_cfg_set_s32(ppvVar24,"h264:cabac_idc",0);
                mpp_enc_cfg_set_s32(ppvVar24,"h264:trans8x8",1);
                if (pMVar2->rc_mode == 2) {
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_init",0x14);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_max",0x10);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_min",0x10);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_max_i",0x14);
                  pcVar22 = "h264:qp_min_i";
                  uVar17 = 0x14;
                }
                else {
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_init",0x1a);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_max",0x33);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_min",10);
                  mpp_enc_cfg_set_s32(ppvVar24,"h264:qp_max_i",0x2e);
                  pcVar22 = "h264:qp_min_i";
LAB_00107d24:
                  uVar17 = 0x12;
                }
              }
              else {
                if (MVar1 != MPP_VIDEO_CodingMJPEG) goto LAB_00107b7c;
                mpp_enc_cfg_set_s32(ppvVar24,"jpeg:q_factor",0x50);
                mpp_enc_cfg_set_s32(ppvVar24,"jpeg:qf_max",99);
                pcVar22 = "jpeg:qf_min";
                uVar17 = 1;
              }
LAB_00107d2c:
              mpp_enc_cfg_set_s32(ppvVar24,pcVar22,uVar17);
            }
            else {
              if (MVar1 == MPP_VIDEO_CodingVP8) {
                mpp_enc_cfg_set_s32(ppvVar24,"vp8:qp_init",0x28);
                mpp_enc_cfg_set_s32(ppvVar24,"vp8:qp_max",0x7f);
                mpp_enc_cfg_set_s32(ppvVar24,"vp8:qp_min",0);
                mpp_enc_cfg_set_s32(ppvVar24,"vp8:qp_max_i",0x7f);
                pcVar22 = "vp8:qp_min_i";
                uVar17 = 0;
                goto LAB_00107d2c;
              }
              if (MVar1 == MPP_VIDEO_CodingHEVC) {
                mpp_enc_cfg_set_s32(ppvVar24,"h265:qp_init",-(uint)(pMVar2->rc_mode == 2) | 0x1a);
                mpp_enc_cfg_set_s32(ppvVar24,"h265:qp_max",0x33);
                mpp_enc_cfg_set_s32(ppvVar24,"h265:qp_min",10);
                mpp_enc_cfg_set_s32(ppvVar24,"h265:qp_max_i",0x2e);
                pcVar22 = "h265:qp_min_i";
                goto LAB_00107d24;
              }
LAB_00107b7c:
              _mpp_log_l(2,"mpi_rc_test","unsupport encoder coding type %d\n","mpi_rc_enc_init");
            }
            ppvVar26 = local_98;
            MVar9 = (*pMVar3->control)(pvVar4,MPP_ENC_SET_CFG,ppvVar24);
            if (MVar9 != MPP_OK) {
              pcVar22 = "mpi control enc set cfg failed ret %d\n";
LAB_00107d80:
              _mpp_log_l(2,"mpi_rc_test",pcVar22,0,MVar9);
              cmd = local_80;
              goto LAB_00106eff;
            }
            MVar9 = (*pMVar3->control)(pvVar4,MPP_ENC_SET_SEI_CFG,&local_90);
            cmd = local_80;
            if (MVar9 != MPP_OK) {
              pcVar22 = "mpi control enc set sei cfg failed ret %d\n";
              goto LAB_00107d80;
            }
          }
          else {
            _mpp_log_l(2,"mpi_rc_test","mpp_create encoder failed\n",0);
            ppvVar26 = local_98;
LAB_00106eff:
            if (MVar9 < MPP_OK) goto LAB_00106a84;
          }
          pthread_create(&ctx->dec_thr,(pthread_attr_t *)0x0,rc2_pre_dec_thread,ctx);
          local_78 = &ctx->enc_pkt;
          do {
            pMVar3 = *local_68;
            pvVar4 = *local_60;
            local_a0 = (MppParam)0x0;
            while (MVar9 = (*pMVar3->decode_get_frame)(pvVar4,&local_a0), MVar9 == MPP_OK) {
              if (local_a0 == (MppParam)0x0) {
                usleep(3000);
              }
              else {
                RVar11 = mpp_frame_get_eos();
                ctx->frm_eos = RVar11;
                iVar10 = mpp_frame_get_info_change(local_a0);
                if (iVar10 == 0) {
                  iVar10 = ctx->enc_cmd->frame_num;
                  if ((0 < iVar10) && (iVar10 < ctx->frm_idx)) {
                    ctx->loop_end = 1;
                    mpp_frame_set_eos(local_a0,1);
                    RVar11 = mpp_frame_get_eos(local_a0);
                    ctx->frm_eos = RVar11;
                  }
                  ppvVar8 = local_50;
                  ppMVar7 = local_58;
                  (*(*local_58)->encode_put_frame)(*local_50,local_a0);
                  ppvVar24 = local_78;
                  (*(*ppMVar7)->encode_get_packet)(*ppvVar8,local_78);
                  if (*ppvVar24 != (MppPacket)0x0) {
                    uVar19 = mpp_packet_get_length();
                    RVar23 = (RK_U32)uVar19;
                    (ctx->stat).frame_size = RVar23;
                    RVar20 = ctx->stream_size_1s + RVar23;
                    ctx->stream_size_1s = RVar20;
                    ctx->total_bits = ctx->total_bits + uVar19 * 8;
                    if (((ctx->frm_idx - ctx->calc_base_idx) + 1) % (uint)(ctx->rc_cfg).fps_in_num
                        == 0) {
                      (ctx->stat).ins_bitrate = RVar20;
                      ctx->stream_size_1s = 0;
                    }
                    __ptr = (void *)mpp_packet_get_pos(ctx->enc_pkt);
                    pFVar14 = (FILE *)(ctx->file).fp_enc_out;
                    if (pFVar14 != (FILE *)0x0) {
                      fwrite(__ptr,1,uVar19,pFVar14);
                    }
                    if (ctx->dec_in_buf_post_size < uVar19) {
                      uVar25 = RVar23 + 0xfff & 0xfffff000;
                      pRVar16 = (RK_U8 *)mpp_osal_realloc("mpi_rc_enc",ctx->dec_in_buf_post,uVar25);
                      ctx->dec_in_buf_post = pRVar16;
                      ctx->dec_in_buf_post_size = uVar25;
                      mpp_packet_set_data(ctx->dec_pkt_post,pRVar16);
                      cmd = local_80;
                      mpp_packet_set_size(ctx->dec_pkt_post,uVar25);
                      mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                      mpp_packet_set_length(ctx->dec_pkt_post,0);
                    }
                    mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                    mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                    mpp_packet_set_length(ctx->dec_pkt_post,uVar19);
                    mpp_packet_set_size(ctx->dec_pkt_post,uVar19);
                    iVar10 = mpp_packet_has_meta(ctx->enc_pkt);
                    if (iVar10 == 0) {
                      if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                        mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                        mpi_rc_dec_post_decode(ctx,local_a0);
                      }
                    }
                    else {
                      local_90 = (MppParam)0x0;
                      uVar17 = mpp_packet_get_meta(ctx->enc_pkt);
                      mpp_meta_get_frame(uVar17,0x6966726d,&local_90);
                      if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                        mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                        mpi_rc_dec_post_decode(ctx,local_90);
                      }
                      if (local_90 != (MppParam)0x0) {
                        local_a0 = local_90;
                      }
                    }
                    RVar20 = mpp_packet_get_eos(ctx->enc_pkt);
                    ctx->enc_pkt_eos = RVar20;
                    ctx->frm_idx = ctx->frm_idx + 1;
                    mpp_packet_deinit(local_78);
                  }
                }
                else {
                  _mpp_log_l(4,"mpi_rc_test","decode_get_frame get info changed found\n",0);
                  (*pMVar3->control)(pvVar4,MPP_DEC_SET_INFO_CHANGE_READY,(MppParam)0x0);
                  pvVar6 = local_a0;
                  pvVar5 = ctx->cfg;
                  uVar12 = mpp_frame_get_width(local_a0);
                  mpp_enc_cfg_set_s32(pvVar5,"prep:width",uVar12);
                  pvVar5 = ctx->cfg;
                  uVar12 = mpp_frame_get_height(pvVar6);
                  mpp_enc_cfg_set_s32(pvVar5,"prep:height",uVar12);
                  pvVar5 = ctx->cfg;
                  uVar12 = mpp_frame_get_hor_stride(pvVar6);
                  mpp_enc_cfg_set_s32(pvVar5,"prep:hor_stride",uVar12);
                  pvVar5 = ctx->cfg;
                  uVar12 = mpp_frame_get_ver_stride(pvVar6);
                  mpp_enc_cfg_set_s32(pvVar5,"prep:ver_stride",uVar12);
                  pvVar5 = ctx->cfg;
                  uVar12 = mpp_frame_get_fmt(pvVar6);
                  mpp_enc_cfg_set_s32(pvVar5,"prep:format",uVar12);
                  (*ctx->enc_mpi->control)(ctx->enc_ctx,MPP_ENC_SET_CFG,ctx->cfg);
                  (*ctx->dec_mpi_post->control)(ctx->dec_ctx_post,MPP_DEC_SET_FRAME_INFO,pvVar6);
                  RVar15 = mpp_time();
                  ctx->start_enc = RVar15;
                }
                mpp_frame_deinit(&local_a0);
                local_a0 = (MppParam)0x0;
                if (ctx->enc_pkt_eos != 0) goto LAB_00107389;
              }
            }
            _mpp_log_l(2,"mpi_rc_test","decode_get_frame failed ret %d\n",0,MVar9);
          } while (ctx->enc_pkt_eos == 0);
LAB_00107389:
          _mpp_log_l(4,"mpi_rc_test","stream finish\n",0);
          lVar18 = mpp_time();
          uVar19 = lVar18 - ctx->start_enc;
          _mpp_log_l(SUB84((double)(((float)ctx->frm_idx * 1e+06) / (float)uVar19),0),4,
                     "mpi_rc_test","enc_dec %d frame use time %lld ms frm rate %.2f\n",0,
                     ctx->frm_idx,uVar19 / 1000);
          iVar10 = ctx->frm_idx;
          if ((long)iVar10 != 0) {
            pMVar2 = ctx->enc_cmd;
            pcVar27 = "smart_p";
            pcVar22 = "smart_p";
            if (pMVar2->gop_mode == 0) {
              pcVar22 = "normal_p";
            }
            _mpp_log_l(SUB84(ctx->total_psnrs * (1.0 / (double)iVar10),0),
                       (1.0 / (double)iVar10) * ctx->total_ssims,4,"mpi_rc_test",
                       "%s: %s: average: bps %d | psnr %5.2f | ssim %5.5f",0,pMVar2->file_input,
                       pcVar22,(int)(ctx->total_bits / (ulong)(long)iVar10) * 0x1e);
            pFVar14 = (FILE *)(ctx->file).fp_stat;
            if (pFVar14 != (FILE *)0x0) {
              if (pMVar2->gop_mode == 0) {
                pcVar27 = "normal_p";
              }
              dVar28 = 1.0 / (double)ctx->frm_idx;
              fprintf(pFVar14,"%s: %s: average: bps %dk | psnr %5.2f | ssim %5.5f \n",
                      SUB84(ctx->total_psnrs * dVar28,0),dVar28 * ctx->total_ssims,
                      pMVar2->file_input,pcVar27,
                      (ulong)(uint)((int)(ctx->total_bits / (ulong)(long)ctx->frm_idx) * 0x1e) /
                      1000);
            }
          }
          MVar9 = (*(*local_58)->reset)(*local_50);
          if (MPP_NOK < MVar9) {
            MVar9 = (*(*local_68)->reset)(*local_60);
            ppvVar26 = local_98;
            if ((MVar9 < MPP_OK) || (MVar9 = (*(*local_48)->reset)(*local_40), MVar9 < MPP_OK))
            goto LAB_00106a84;
            goto LAB_001075a6;
          }
        }
      }
      else {
        pcVar22 = "mpp_create decoder failed\n";
LAB_00106c9b:
        _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
        if (MPP_NOK < MVar9) goto LAB_00106cb1;
      }
LAB_00107580:
      _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
      ppvVar26 = local_98;
    }
    else {
      _mpp_log_l(2,"mpi_rc_test","failed to get buffer group for output packet ret %d\n",0,iVar10);
LAB_00106a39:
      ctx->dec_ctx_post = (MppCtx)0x0;
      ctx->dec_ctx_pre = (MppCtx)0x0;
      if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
        mpp_osal_free("mpi_rc_buffer_init");
      }
      ctx->dec_in_buf_post = (RK_U8 *)0x0;
      if (ctx->pkt_grp != (MppBufferGroup)0x0) {
        mpp_buffer_group_put();
        *ppvVar26 = (MppBufferGroup)0x0;
      }
      if (-1 < iVar10) goto LAB_00106b15;
LAB_00106a84:
      _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
    }
LAB_001075a6:
    pthread_join(ctx->dec_thr,(void **)0x0);
    if (ctx->enc_ctx != (MppCtx)0x0) {
      mpp_destroy();
      ctx->enc_ctx = (MppCtx)0x0;
    }
    if (*ppvVar26 != (MppBufferGroup)0x0) {
      mpp_buffer_group_put();
      *ppvVar26 = (MppBufferGroup)0x0;
    }
    if (ctx->dec_pkt_post != (MppPacket)0x0) {
      mpp_packet_deinit(&ctx->dec_pkt_post);
      ctx->dec_pkt_post = (MppPacket)0x0;
    }
    if (ctx->dec_pkt_pre != (MppPacket)0x0) {
      mpp_packet_deinit(&ctx->dec_pkt_pre);
      ctx->dec_pkt_pre = (MppPacket)0x0;
    }
    if (ctx->cfg != (MppEncCfg)0x0) {
      mpp_enc_cfg_deinit();
      ctx->cfg = (MppEncCfg)0x0;
    }
    if (ctx->dec_ctx_post != (MppCtx)0x0) {
      mpp_destroy();
      ctx->dec_ctx_post = (MppCtx)0x0;
    }
    if (ctx->dec_ctx_pre != (MppCtx)0x0) {
      mpp_destroy();
      ctx->dec_ctx_pre = (MppCtx)0x0;
    }
    if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
      mpp_osal_free("mpi_rc_codec");
    }
    ctx->dec_in_buf_post = (RK_U8 *)0x0;
    if (ctx->dec_in_buf_pre != (RK_U8 *)0x0) {
      mpp_osal_free("mpi_rc_codec");
    }
    ctx->dec_in_buf_pre = (RK_U8 *)0x0;
    MVar9 = MPP_OK;
  }
  pFVar14 = (FILE *)(ctx->file).fp_enc_out;
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
    (ctx->file).fp_enc_out = (FILE *)0x0;
  }
  pFVar14 = (FILE *)(ctx->file).fp_stat;
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
    (ctx->file).fp_stat = (FILE *)0x0;
  }
  pFVar14 = (FILE *)(ctx->file).fp_input;
  if (pFVar14 != (FILE *)0x0) {
    fclose(pFVar14);
    (ctx->file).fp_input = (FILE *)0x0;
  }
  if (ctx->reader != (FileReader)0x0) {
    reader_deinit(ctx->reader);
    ctx->reader = (FileReader)0x0;
  }
  if (ctx->com_buf != (RK_U8 *)0x0) {
    mpp_osal_free("mpi_rc_deinit");
  }
  ctx->com_buf = (RK_U8 *)0x0;
LAB_00107726:
  mpi_enc_test_cmd_put(cmd);
  return MVar9;
}

Assistant:

int main(int argc, char **argv)
{
    MpiEncTestArgs* enc_cmd = mpi_enc_test_cmd_get();
    MpiRc2TestCtx *ctx = NULL;
    MPP_RET ret = MPP_OK;

    ret = mpi_enc_test_cmd_update_by_args(enc_cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(enc_cmd);

    ctx = mpp_calloc(MpiRc2TestCtx, 1);
    if (NULL == ctx) {
        ret = MPP_ERR_MALLOC;
        goto DONE;
    }

    ctx->enc_cmd = enc_cmd;

    ret = mpi_rc_init(ctx);
    if (ret) {
        mpp_err("mpi_rc_init failded ret %d", ret);
        goto DONE;
    }

    ret = mpi_rc_codec(ctx);
    if (ret)
        mpp_err("mpi_rc_codec failded ret %d", ret);

DONE:
    if (ctx) {
        mpi_rc_deinit(ctx);
        ctx = NULL;
    }

    mpi_enc_test_cmd_put(enc_cmd);

    return (int)ret;
}